

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

void Acb_Ntk4CollectAdd(Acb_Ntk_t *pNtk,int iObj,Vec_Int_t *vRes,Vec_Int_t *vDists,int Dist)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if ((iObj < 0) || ((pNtk->vObjTrav).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar3 = (pNtk->vObjTrav).pArray;
  iVar1 = pNtk->nObjTravs;
  iVar2 = piVar3[(uint)iObj];
  piVar3[(uint)iObj] = iVar1;
  if (iVar2 == iVar1) {
    return;
  }
  if (iObj < vDists->nSize) {
    vDists->pArray[(uint)iObj] = Dist;
    Vec_IntPush(vRes,iObj);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Acb_Ntk4CollectAdd( Acb_Ntk_t * pNtk, int iObj, Vec_Int_t * vRes, Vec_Int_t * vDists, int Dist )
{
    if ( Acb_ObjSetTravIdCur(pNtk, iObj) )
        return;
    Vec_IntWriteEntry( vDists, iObj, Dist );
    Vec_IntPush( vRes, iObj );
}